

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_tri_ideal(REF_GRID ref_grid,REF_INT node,REF_INT tri,REF_DBL *ideal_location)

{
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  uint uVar2;
  undefined8 uVar3;
  REF_INT node_00;
  long lVar4;
  char *pcVar5;
  int node_01;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  REF_DBL dn [3];
  REF_DBL dt [3];
  REF_DBL m [6];
  REF_DBL log_m [6];
  REF_DBL log_m2 [6];
  REF_DBL log_m1 [6];
  REF_DBL log_m0 [6];
  REF_INT nodes [27];
  double local_1d8 [4];
  double local_1b8 [4];
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  REF_DBL local_168 [6];
  REF_DBL local_138;
  double local_130 [5];
  REF_DBL local_108;
  double local_100 [5];
  REF_DBL local_d8;
  double adStack_d0 [5];
  int local_a8;
  int local_a4;
  int local_a0;
  
  ref_node = ref_grid->node;
  uVar2 = ref_cell_nodes(ref_grid->cell[3],tri,&local_a8);
  if (uVar2 == 0) {
    node_01 = -1;
    if (local_a8 == node) {
      node_01 = local_a0;
    }
    node_00 = -1;
    if (local_a8 == node) {
      node_00 = local_a4;
    }
    if (local_a4 == node) {
      node_00 = local_a0;
      node_01 = local_a8;
    }
    if (local_a0 == node) {
      node_00 = local_a8;
      node_01 = local_a4;
    }
    if ((node_00 == -1) || (node_01 == -1)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x12d,"ref_smooth_tri_ideal","empty triangle side");
      return 1;
    }
    pRVar1 = ref_node->real;
    lVar4 = 0;
    do {
      ideal_location[lVar4] = (pRVar1[node_00 * 0xf + lVar4] + pRVar1[node_01 * 0xf + lVar4]) * 0.5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar4 = 0;
    do {
      local_1d8[lVar4] = pRVar1[node * 0xf + lVar4] - ideal_location[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar4 = 0;
    do {
      local_1b8[lVar4] = pRVar1[node_01 * 0xf + lVar4] - pRVar1[node_00 * 0xf + lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    dVar7 = local_1b8[2] * local_1b8[2] + local_1b8[0] * local_1b8[0] + local_1b8[1] * local_1b8[1];
    dVar6 = local_1b8[2] * local_1d8[2] + local_1b8[0] * local_1d8[0] + local_1b8[1] * local_1d8[1];
    dVar10 = dVar7 * 1e+20;
    if (dVar10 <= -dVar10) {
      dVar10 = -dVar10;
    }
    dVar9 = -dVar6;
    if (dVar6 <= dVar9) {
      dVar6 = dVar9;
    }
    if (dVar10 <= dVar6) {
      printf("projection = %e tangent_length = %e\n");
      return 4;
    }
    lVar4 = 0;
    do {
      local_1d8[lVar4] = local_1b8[lVar4] * (dVar9 / dVar7) + local_1d8[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    uVar2 = ref_math_normalize(local_1d8);
    if (uVar2 == 0) {
      uVar2 = ref_node_metric_get_log(ref_node,node_00,&local_d8);
      if (uVar2 == 0) {
        uVar2 = ref_node_metric_get_log(ref_node,node_01,&local_108);
        if (uVar2 == 0) {
          uVar2 = ref_node_metric_get_log(ref_node,node,&local_138);
          if (uVar2 == 0) {
            lVar4 = 0;
            do {
              auVar8._0_8_ = adStack_d0[lVar4 + -1] + local_100[lVar4 + -1] + local_130[lVar4 + -1];
              auVar8._8_8_ = adStack_d0[lVar4] + local_100[lVar4] + local_130[lVar4];
              auVar8 = divpd(auVar8,_DAT_002006d0);
              *(undefined1 (*) [16])(local_168 + lVar4) = auVar8;
              lVar4 = lVar4 + 2;
            } while (lVar4 != 6);
            uVar2 = ref_matrix_exp_m(local_168,&local_198);
            if (uVar2 == 0) {
              dVar10 = (local_170 * local_1d8[2] +
                       local_188 * local_1d8[0] + local_1d8[1] * local_178) * local_1d8[2] +
                       (local_188 * local_1d8[2] +
                       local_198 * local_1d8[0] + local_190 * local_1d8[1]) * local_1d8[0] +
                       (local_178 * local_1d8[2] +
                       local_190 * local_1d8[0] + local_180 * local_1d8[1]) * local_1d8[1];
              if (dVar10 < 0.0) {
                dVar10 = sqrt(dVar10);
              }
              else {
                dVar10 = SQRT(dVar10);
              }
              dVar6 = dVar10 * 1e+20;
              if (dVar6 <= -dVar6) {
                dVar6 = -dVar6;
              }
              if (dVar6 <= 0.8660254037844386) {
                printf(" length_in_metric = %e, not invertible\n");
                return 4;
              }
              lVar4 = 0;
              do {
                ideal_location[lVar4] =
                     local_1d8[lVar4] * (0.8660254037844386 / dVar10) + ideal_location[lVar4];
                lVar4 = lVar4 + 1;
              } while (lVar4 != 3);
              return 0;
            }
            pcVar5 = "exp avg";
            uVar3 = 0x14a;
          }
          else {
            pcVar5 = "get node log m";
            uVar3 = 0x148;
          }
        }
        else {
          pcVar5 = "get n1 log m";
          uVar3 = 0x147;
        }
      }
      else {
        pcVar5 = "get n0 log m";
        uVar3 = 0x146;
      }
    }
    else {
      pcVar5 = "normalize direction";
      uVar3 = 0x143;
    }
  }
  else {
    pcVar5 = "get tri";
    uVar3 = 0x11e;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar3,
         "ref_smooth_tri_ideal",(ulong)uVar2,pcVar5);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tri_ideal(REF_GRID ref_grid, REF_INT node,
                                        REF_INT tri, REF_DBL *ideal_location) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT n0, n1;
  REF_INT ixyz, i;
  REF_DBL dn[3];
  REF_DBL dt[3];
  REF_DBL log_m0[6], log_m1[6], log_m2[6], log_m[6];
  REF_DBL m[6];
  REF_DBL tangent_length, projection, scale, length_in_metric;

  RSS(ref_cell_nodes(ref_grid_tri(ref_grid), tri, nodes), "get tri");
  n0 = REF_EMPTY;
  n1 = REF_EMPTY;
  if (node == nodes[0]) {
    n0 = nodes[1];
    n1 = nodes[2];
  }
  if (node == nodes[1]) {
    n0 = nodes[2];
    n1 = nodes[0];
  }
  if (node == nodes[2]) {
    n0 = nodes[0];
    n1 = nodes[1];
  }
  if (n0 == REF_EMPTY || n1 == REF_EMPTY) THROW("empty triangle side");

  for (ixyz = 0; ixyz < 3; ixyz++)
    ideal_location[ixyz] = 0.5 * (ref_node_xyz(ref_node, ixyz, n0) +
                                  ref_node_xyz(ref_node, ixyz, n1));
  for (ixyz = 0; ixyz < 3; ixyz++)
    dn[ixyz] = ref_node_xyz(ref_node, ixyz, node) - ideal_location[ixyz];
  for (ixyz = 0; ixyz < 3; ixyz++)
    dt[ixyz] =
        ref_node_xyz(ref_node, ixyz, n1) - ref_node_xyz(ref_node, ixyz, n0);

  tangent_length = ref_math_dot(dt, dt);
  projection = ref_math_dot(dn, dt);

  if (ref_math_divisible(projection, tangent_length)) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      dn[ixyz] -= (projection / tangent_length) * dt[ixyz];
  } else {
    printf("projection = %e tangent_length = %e\n", projection, tangent_length);
    return REF_DIV_ZERO;
  }

  RSS(ref_math_normalize(dn), "normalize direction");

  /* averaged metric */
  RSS(ref_node_metric_get_log(ref_node, n0, log_m0), "get n0 log m");
  RSS(ref_node_metric_get_log(ref_node, n1, log_m1), "get n1 log m");
  RSS(ref_node_metric_get_log(ref_node, node, log_m2), "get node log m");
  for (i = 0; i < 6; i++) log_m[i] = (log_m0[i] + log_m1[i] + log_m2[i]) / 3.0;
  RSS(ref_matrix_exp_m(log_m, m), "exp avg");

  length_in_metric = ref_matrix_sqrt_vt_m_v(m, dn);

  scale = 0.5 * sqrt(3.0); /* altitude of equilateral triangle */
  if (ref_math_divisible(scale, length_in_metric)) {
    scale = scale / length_in_metric;
  } else {
    printf(" length_in_metric = %e, not invertible\n", length_in_metric);
    return REF_DIV_ZERO;
  }

  for (ixyz = 0; ixyz < 3; ixyz++) ideal_location[ixyz] += scale * dn[ixyz];

  return REF_SUCCESS;
}